

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

int P_Find3DFloor(sector_t *sec,DVector3 *pos,bool above,bool floor,double *cmpz)

{
  F3DFloor *pFVar1;
  double dVar2;
  double dVar3;
  int i;
  ulong uVar4;
  DVector2 local_48;
  
  if (sec == (sector_t *)0x0) {
    local_48.X = pos->X;
    local_48.Y = pos->Y;
    sec = P_PointInSector(&local_48);
  }
  local_48.X = pos->X;
  local_48.Y = pos->Y;
  dVar2 = secplane_t::ZatPoint(&sec->ceilingplane,&local_48);
  *cmpz = dVar2;
  if (pos->Z < dVar2) {
    local_48.X = pos->X;
    local_48.Y = pos->Y;
    dVar2 = secplane_t::ZatPoint(&sec->floorplane,&local_48);
    *cmpz = dVar2;
    if (dVar2 < pos->Z) {
      for (uVar4 = 0;
          (long)uVar4 <
          (long)(int)(sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          uVar4 = uVar4 + 1) {
        pFVar1 = (sec->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar4];
        if ((~pFVar1->flags & 3) == 0) {
          if (above) {
            if (floor) {
              dVar2 = pos->Z;
              local_48.X = pos->X;
              local_48.Y = pos->Y;
              dVar3 = secplane_t::ZatPoint((pFVar1->top).plane,&local_48);
              *cmpz = dVar3;
              if (dVar2 < dVar3) goto LAB_00476873;
            }
            else {
LAB_00476873:
              dVar2 = pos->Z;
              local_48.X = pos->X;
              local_48.Y = pos->Y;
              dVar3 = secplane_t::ZatPoint((pFVar1->bottom).plane,&local_48);
              *cmpz = dVar3;
              if (dVar2 < dVar3) goto LAB_0047690d;
            }
            uVar4 = (ulong)((int)uVar4 - 1);
LAB_0047691d:
            return (int)uVar4;
          }
          if (!floor) {
            dVar2 = pos->Z;
            local_48.X = pos->X;
            local_48.Y = pos->Y;
            dVar3 = secplane_t::ZatPoint((pFVar1->bottom).plane,&local_48);
            *cmpz = dVar3;
            if (dVar2 <= dVar3) goto LAB_0047691d;
          }
          dVar2 = pos->Z;
          local_48.X = pos->X;
          local_48.Y = pos->Y;
          dVar3 = secplane_t::ZatPoint((pFVar1->top).plane,&local_48);
          *cmpz = dVar3;
          if (dVar2 <= dVar3) goto LAB_0047691d;
        }
LAB_0047690d:
      }
    }
  }
  return -1;
}

Assistant:

int	P_Find3DFloor(sector_t * sec, const DVector3 &pos, bool above, bool floor, double &cmpz)
{
	// If no sector given, find the one appropriate
	if (sec == NULL)
		sec = P_PointInSector(pos);

	// Above normal ceiling
	cmpz = sec->ceilingplane.ZatPoint(pos);
	if (pos.Z >= cmpz)
		return -1;

	// Below normal floor
	cmpz = sec->floorplane.ZatPoint(pos);
	if (pos.Z <= cmpz)
		return -1;

	// Looking through planes from top to bottom
	for (int i = 0; i < (signed)sec->e->XFloor.ffloors.Size(); ++i)
	{
		F3DFloor *rover = sec->e->XFloor.ffloors[i];

		// We are only interested in solid 3D floors here
		if(!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		if (above)
		{
			// z is above that floor
			if (floor && (pos.Z >= (cmpz = rover->top.plane->ZatPoint(pos))))
				return i - 1;
			// z is above that ceiling
			if (pos.Z >= (cmpz = rover->bottom.plane->ZatPoint(pos)))
				return i - 1;
		}
		else // below
		{
			// z is below that ceiling
			if (!floor && (pos.Z <= (cmpz = rover->bottom.plane->ZatPoint(pos))))
				return i;
			// z is below that floor
			if (pos.Z <= (cmpz = rover->top.plane->ZatPoint(pos)))
				return i;
		}
	}

	// Failsafe
	return -1;
}